

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::TryConsume(ParserImpl *this,string *value)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  
  __n = (this->tokenizer_).current_.text._M_string_length;
  if (__n == value->_M_string_length) {
    if (__n == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,(value->_M_dataplus)._M_p,__n);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if (bVar2 != false) {
    io::Tokenizer::Next(&this->tokenizer_);
  }
  return bVar2;
}

Assistant:

bool TryConsume(const string& value) {
    if (tokenizer_.current().text == value) {
      tokenizer_.Next();
      return true;
    } else {
      return false;
    }
  }